

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O1

uint8_t * google::protobuf::internal::WireFormatLite::WriteEnumToArray
                    (int field_number,int value,uint8_t *target)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = field_number << 3;
  uVar6 = uVar5;
  if (0x7f < uVar5) {
    do {
      *target = (byte)uVar6 | 0x80;
      uVar5 = uVar6 >> 7;
      target = target + 1;
      bVar1 = 0x3fff < uVar6;
      uVar6 = uVar5;
    } while (bVar1);
  }
  *target = (byte)uVar5;
  pbVar2 = target + 1;
  uVar3 = (ulong)value;
  uVar4 = uVar3;
  if (0x7f < (uint)value) {
    do {
      *pbVar2 = (byte)uVar4 | 0x80;
      uVar3 = uVar4 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar3;
    } while (bVar1);
  }
  *pbVar2 = (byte)uVar3;
  return pbVar2 + 1;
}

Assistant:

inline uint8_t* WireFormatLite::WriteEnumToArray(int field_number, int value,
                                                 uint8_t* target) {
  target = WriteTagToArray(field_number, WIRETYPE_VARINT, target);
  return WriteEnumNoTagToArray(value, target);
}